

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

word Gia_ManRandomW(int fReset)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = Gia_ManRandom(fReset);
  uVar2 = Gia_ManRandom(fReset);
  return CONCAT44(uVar1,uVar2);
}

Assistant:

word Gia_ManRandomW( int fReset )
{ 
    return ((word)Gia_ManRandom(fReset) << 32) | ((word)Gia_ManRandom(fReset) << 0);
}